

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O1

int ImgIoUtilReadFromStdin(uint8_t **data,size_t *data_size)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  uint8_t *__ptr;
  
  if (data_size != (size_t *)0x0 && data != (uint8_t **)0x0) {
    *data = (uint8_t *)0x0;
    *data_size = 0;
    if (_stdin != (FILE *)0x0) {
      uVar3 = 0;
      __ptr = (uint8_t *)0x0;
      sVar5 = 0;
      do {
        iVar1 = feof(_stdin);
        if (iVar1 != 0) goto LAB_00102b0d;
        sVar4 = sVar5;
        if (sVar5 == 0) {
          sVar4 = 0x4000;
        }
        puVar2 = (uint8_t *)realloc(__ptr,sVar5 + sVar4 + 1);
        if (puVar2 == (uint8_t *)0x0) {
          iVar1 = 4;
        }
        else {
          sVar5 = sVar5 + sVar4;
          sVar4 = fread(puVar2 + uVar3,1,sVar4,_stdin);
          uVar3 = uVar3 + sVar4;
          iVar1 = (uint)(uVar3 < sVar5) * 3;
          __ptr = puVar2;
        }
      } while (iVar1 == 0);
      if (iVar1 == 3) {
LAB_00102b0d:
        iVar1 = ferror(_stdin);
        if (iVar1 == 0) {
          if (__ptr != (uint8_t *)0x0) {
            __ptr[uVar3] = '\0';
          }
          *data = __ptr;
          *data_size = uVar3;
          return 1;
        }
      }
      else if (iVar1 != 4) {
        return iVar1;
      }
      ImgIoUtilReadFromStdin_cold_1();
    }
  }
  return 0;
}

Assistant:

int ImgIoUtilReadFromStdin(const uint8_t** data, size_t* data_size) {
  static const size_t kBlockSize = 16384;  // default initial size
  size_t max_size = 0;
  size_t size = 0;
  uint8_t* input = NULL;

  if (data == NULL || data_size == NULL) return 0;
  *data = NULL;
  *data_size = 0;

  if (!ImgIoUtilSetBinaryMode(stdin)) return 0;

  while (!feof(stdin)) {
    // We double the buffer size each time and read as much as possible.
    const size_t extra_size = (max_size == 0) ? kBlockSize : max_size;
    // we allocate one extra byte for the \0 terminator
    void* const new_data = realloc(input, max_size + extra_size + 1);
    if (new_data == NULL) goto Error;
    input = (uint8_t*)new_data;
    max_size += extra_size;
    size += fread(input + size, 1, extra_size, stdin);
    if (size < max_size) break;
  }
  if (ferror(stdin)) goto Error;
  if (input != NULL) input[size] = '\0';  // convenient 0-terminator
  *data = input;
  *data_size = size;
  return 1;

 Error:
  free(input);
  fprintf(stderr, "Could not read from stdin\n");
  return 0;
}